

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O0

GdlGlyphClassMember * __thiscall
GdlGlyphClassDefn::AddGlyphToClass
          (GdlGlyphClassDefn *this,GrpLineAndFile *lnf,GlyphType glft,int nFirst,int nLast,
          utf16 wCodePage)

{
  GdlGlyphClassMember *this_00;
  GrpLineAndFile *in_RDI;
  GdlGlyphDefn *pglf;
  GdlGlyphClassMember *lnf_00;
  int in_stack_ffffffffffffffc8;
  GlyphType in_stack_ffffffffffffffcc;
  GdlGlyphClassDefn *in_stack_ffffffffffffffd0;
  
  this_00 = (GdlGlyphClassMember *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn
            ((GdlGlyphDefn *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8,(int)((ulong)this_00 >> 0x20),(utf16)((ulong)this_00 >> 0x10)
            );
  lnf_00 = this_00;
  GdlObject::SetLineAndFile((GdlObject *)this_00,in_RDI);
  AddMember(in_stack_ffffffffffffffd0,
            (GdlGlyphClassMember *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
            (GrpLineAndFile *)lnf_00);
  return this_00;
}

Assistant:

GdlGlyphClassMember * GdlGlyphClassDefn::AddGlyphToClass(GrpLineAndFile const& lnf,
	GlyphType glft, int nFirst, int nLast, utf16 wCodePage)
{
	GdlGlyphDefn * pglf = new GdlGlyphDefn(glft, nFirst, nLast, wCodePage);
	pglf->SetLineAndFile(lnf);
	AddMember(pglf, lnf);
	return pglf;
}